

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipe.c
# Opt level: O0

int uv_pipe_open(uv_pipe_t *handle,uv_file fd)

{
  int iVar1;
  uint uVar2;
  int *piVar3;
  bool bVar4;
  int err;
  int mode;
  int flags;
  uv_file fd_local;
  uv_pipe_t *handle_local;
  
  err = 0;
  iVar1 = uv__fd_exists(handle->loop,fd);
  if (iVar1 == 0) {
    do {
      uVar2 = fcntl(fd,3);
      bVar4 = false;
      if (uVar2 == 0xffffffff) {
        piVar3 = __errno_location();
        bVar4 = *piVar3 == 4;
      }
    } while (bVar4);
    if (uVar2 == 0xffffffff) {
      piVar3 = __errno_location();
      handle_local._4_4_ = -*piVar3;
    }
    else {
      handle_local._4_4_ = uv__nonblock_ioctl(fd,1);
      if (handle_local._4_4_ == 0) {
        if ((uVar2 & 3) != 1) {
          err = 0x4000;
        }
        if ((uVar2 & 3) != 0) {
          err = err | 0x8000;
        }
        handle_local._4_4_ = uv__stream_open((uv_stream_t *)handle,fd,err);
      }
    }
  }
  else {
    handle_local._4_4_ = -0x11;
  }
  return handle_local._4_4_;
}

Assistant:

int uv_pipe_open(uv_pipe_t* handle, uv_file fd) {
  int flags;
  int mode;
  int err;
  flags = 0;

  if (uv__fd_exists(handle->loop, fd))
    return UV_EEXIST;

  do
    mode = fcntl(fd, F_GETFL);
  while (mode == -1 && errno == EINTR);

  if (mode == -1)
    return UV__ERR(errno); /* according to docs, must be EBADF */

  err = uv__nonblock(fd, 1);
  if (err)
    return err;

#if defined(__APPLE__) && !defined(CMAKE_BOOTSTRAP)
  err = uv__stream_try_select((uv_stream_t*) handle, &fd);
  if (err)
    return err;
#endif /* defined(__APPLE__) */

  mode &= O_ACCMODE;
  if (mode != O_WRONLY)
    flags |= UV_HANDLE_READABLE;
  if (mode != O_RDONLY)
    flags |= UV_HANDLE_WRITABLE;

  return uv__stream_open((uv_stream_t*)handle, fd, flags);
}